

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void R_CreatePlayerTranslation
               (float h,float s,float v,FPlayerColorSet *colorset,FPlayerSkin *skin,
               FRemapTable *table,FRemapTable *alttable,FRemapTable *pillartable)

{
  byte bVar1;
  FRemapTable *table_00;
  bool bVar2;
  BYTE BVar3;
  int iVar4;
  long lVar5;
  FMemLump FVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  PalEntry *__src;
  PalEntry *__dest;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float v_00;
  float b;
  float g;
  float r;
  float fg;
  float fr;
  FMemLump translump;
  float pv;
  float ps;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  ulong local_90;
  float local_84;
  ulong local_80;
  FRemapTable *local_78;
  float local_6c;
  long local_68;
  float local_5c;
  float local_58;
  float local_54;
  FRemapTable *local_50;
  FMemLump local_48;
  float local_3c;
  float local_38;
  float local_34;
  
  bVar10 = skin->range0start;
  uVar7 = (ulong)bVar10;
  bVar1 = skin->range0end;
  uVar11 = (ulong)bVar1;
  local_a8 = s;
  local_ac = v;
  local_98 = h;
  local_50 = pillartable;
  if (skin->othergame == false) {
    iVar4 = table->NumEntries;
    if (0 < iVar4) {
      lVar5 = 0;
      do {
        table->Remap[lVar5] = (BYTE)lVar5;
        lVar5 = lVar5 + 1;
        iVar4 = table->NumEntries;
      } while (lVar5 < iVar4);
    }
    __dest = table->Palette;
    __src = GPalette.BaseColors;
  }
  else {
    memcpy(table->Remap,OtherGameSkinRemap,(long)table->NumEntries);
    __dest = table->Palette;
    iVar4 = table->NumEntries;
    __src = OtherGameSkinPalette;
  }
  memcpy(__dest,__src,(long)iVar4 << 2);
  if (1 < table->NumEntries) {
    lVar5 = 1;
    do {
      table->Palette[lVar5].field_0.field_0.a = 0xff;
      lVar5 = lVar5 + 1;
    } while (lVar5 < table->NumEntries);
  }
  if (bVar1 == 0 && bVar10 == 0) {
    table->Inactive = true;
    goto LAB_00331a97;
  }
  table->Inactive = false;
  local_84 = local_a8;
  local_94 = local_ac;
  if (colorset == (FPlayerColorSet *)0x0) {
    colorset = (FPlayerColorSet *)0x0;
  }
  else if (-1 < colorset->Lump) {
    iVar4 = FWadCollection::LumpLength(&Wads,colorset->Lump);
    if (iVar4 < 0x100) {
      colorset = (FPlayerColorSet *)0x0;
    }
  }
  uVar12 = (uint)bVar10;
  local_90 = uVar11;
  if (colorset == (FPlayerColorSet *)0x0) {
    iVar4 = (bVar1 - uVar12) + 1;
    fVar13 = (float)iVar4;
    if ((gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) {
      if (gameinfo.gametype == GAME_Hexen) {
        if (local_ac <= 0.1) {
          local_ac = 0.1;
        }
        if (sprites.Array[skin->sprite].field_0.dwName == 0x59414c50) {
          if (bVar10 <= bVar1) {
            iVar4 = 0;
            uVar12 = (uint)bVar10;
            local_80 = uVar7;
            local_78 = alttable;
            do {
              HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,local_a8,
                       *(float *)(&DAT_005e36e0 + (long)(iVar4 / (int)fVar13) * 4) * local_94);
              SetRemap(table,uVar12,local_9c,local_a0,local_a4);
              uVar12 = uVar12 + 1;
              iVar4 = iVar4 + 9;
              alttable = local_78;
            } while (bVar1 + 1 != uVar12);
LAB_0033191c:
            bVar10 = (byte)local_80;
          }
        }
        else if (bVar10 <= bVar1) {
          iVar4 = 0;
          uVar12 = (uint)bVar10;
          local_80 = uVar7;
          local_78 = alttable;
          do {
            HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,
                     *(float *)(&DAT_005e3710 + (long)(iVar4 / (int)fVar13) * 4) * local_84,
                     *(float *)(&DAT_005e3760 + (long)(iVar4 / (int)fVar13) * 4) * local_94);
            SetRemap(table,uVar12,local_9c,local_a0,local_a4);
            uVar12 = uVar12 + 1;
            iVar4 = iVar4 + 0x12;
            alttable = local_78;
          } while (bVar1 + 1 != uVar12);
          goto LAB_0033191c;
        }
      }
      else if (gameinfo.gametype == GAME_Heretic) {
        local_78 = alttable;
        if (bVar10 <= bVar1) {
          local_68 = CONCAT44(local_68._4_4_,local_94 + -0.2352937);
          local_6c = 1.0 / fVar13;
          iVar9 = 0;
          do {
            local_ac = (float)iVar9 * 0.418916 * local_6c + (float)local_68;
            if (1.0 <= local_ac) {
              local_ac = 1.0;
            }
            if (local_ac <= 0.0) {
              local_ac = 0.0;
            }
            HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,local_a8,local_ac);
            SetRemap(table,(uint)bVar10 + iVar9,local_9c,local_a0,local_a4);
            iVar9 = iVar9 + 1;
          } while (iVar4 != iVar9);
        }
        alttable = local_78;
        local_80 = uVar7;
        if (local_78 != (FRemapTable *)0x0) {
          local_84 = local_84 * 1.3;
          if (1.0 <= local_84) {
            local_84 = 1.0;
          }
          local_94 = local_94 * 1.3;
          if (1.0 <= local_94) {
            local_94 = 1.0;
          }
          lVar5 = 0;
          do {
            table_00 = local_78;
            local_a8 = (float)((int)lVar5 + -0x10) * -0.0962 + 0.8965;
            if (local_84 <= local_a8) {
              local_a8 = local_84;
            }
            local_68 = lVar5 + 1;
            local_ac = ((float)(int)local_68 * 0.0489 + 0.2102) * local_94;
            if (1.0 <= local_ac) {
              local_ac = 1.0;
            }
            HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,local_a8,local_ac);
            SetRemap(table_00,(int)lVar5 + 0x91,local_9c,local_a0,local_a4);
            local_6c = local_a8;
            local_3c = local_ac;
            local_54 = (float)GPalette.BaseColors[lVar5 + 0x91].field_0.field_0.r * 0.003921569;
            local_58 = (float)GPalette.BaseColors[lVar5 + 0x91].field_0.field_0.g * 0.003921569;
            local_5c = (float)GPalette.BaseColors[lVar5 + 0x91].field_0.field_0.b * 0.003921569;
            RGBtoHSV(local_54,local_58,local_5c,(float *)&local_48,&local_34,&local_38);
            HSVtoRGB(&local_54,&local_58,&local_5c,local_98,local_6c,local_38 * 0.8 + local_3c * 0.2
                    );
            iVar4 = (int)(local_54 * 255.0);
            if (0xfe < iVar4) {
              iVar4 = 0xff;
            }
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            iVar9 = (int)(local_58 * 255.0);
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            uVar12 = (uint)(local_5c * 255.0);
            if (0xfe < (int)uVar12) {
              uVar12 = 0xff;
            }
            if ((int)uVar12 < 1) {
              uVar12 = 0;
            }
            BVar3 = FColorMatcher::Pick(&ColorMatcher,iVar4,iVar9,uVar12);
            alttable = local_78;
            local_50->Remap[lVar5 + 0x91] = BVar3;
            local_50->Palette[lVar5 + 0x91].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)
                 (iVar9 << 8 | iVar4 << 0x10 | uVar12 | 0xff000000);
            lVar5 = local_68;
          } while (local_68 != 0x18);
          if (local_78->Native != (FNativePalette *)0x0) {
            (*local_78->Native->_vptr_FNativePalette[2])();
          }
        }
        goto LAB_0033191c;
      }
    }
    else {
      local_a8 = local_a8 + -0.23;
      local_ac = local_ac + 0.1;
      if (bVar10 <= bVar1) {
        local_68 = CONCAT44(local_68._4_4_,(1.0 / fVar13) * 0.23);
        local_50 = (FRemapTable *)CONCAT44(local_50._4_4_,(1.0 / fVar13) * 0.94112);
        uVar12 = (uint)bVar10;
        local_80 = uVar7;
        local_78 = alttable;
        do {
          fVar13 = local_a8;
          if (1.0 <= local_a8) {
            fVar13 = 1.0;
          }
          if (fVar13 <= 0.0) {
            fVar13 = 0.0;
          }
          v_00 = local_ac;
          if (1.0 <= local_ac) {
            v_00 = 1.0;
          }
          if (v_00 <= 0.0) {
            v_00 = 0.0;
          }
          HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,fVar13,v_00);
          SetRemap(table,uVar12,local_9c,local_a0,local_a4);
          local_a8 = local_a8 + (float)local_68;
          local_ac = local_ac - local_50._0_4_;
          uVar12 = uVar12 + 1;
          alttable = local_78;
        } while (bVar1 + 1 != uVar12);
        goto LAB_0033191c;
      }
    }
  }
  else {
    if (colorset->Lump < 0) {
      bVar8 = SetRange(table,uVar12,(uint)bVar1,(uint)colorset->FirstColor,(uint)colorset->LastColor
                      );
      if (colorset->NumExtraRanges != '\0') {
        uVar7 = 0;
        do {
          bVar2 = SetRange(table,(uint)colorset->Extra[uVar7].RangeStart,
                           (uint)colorset->Extra[uVar7].RangeEnd,
                           (uint)colorset->Extra[uVar7].FirstColor,
                           (uint)colorset->Extra[uVar7].LastColor);
          bVar8 = (bool)(bVar8 & bVar2);
          uVar7 = uVar7 + 1;
        } while (uVar7 < colorset->NumExtraRanges);
      }
    }
    else {
      FWadCollection::ReadLump((FWadCollection *)&local_48,0x1c74350);
      FVar6.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
      if (*(int *)((long)local_48.Block.Chars + -0xc) != 0) {
        FVar6.Block.Chars = local_48.Block.Chars;
      }
      bVar8 = true;
      if (bVar10 <= (byte)local_90) {
        uVar7 = (ulong)uVar12;
        do {
          table->Remap[uVar7] = GPalette.Remap[*(byte *)((long)FVar6.Block.Chars + uVar7)];
          bVar8 = (bool)(bVar8 & uVar7 == *(byte *)((long)FVar6.Block.Chars + uVar7));
          table->Palette[uVar7].field_0 = GPalette.BaseColors[table->Remap[uVar7]].field_0;
          table->Palette[uVar7].field_0.field_0.a = 0xff;
          uVar7 = uVar7 + 1;
        } while (local_90 + 1 != uVar7);
      }
      FMemLump::~FMemLump(&local_48);
    }
    table->Inactive = bVar8;
  }
  if ((alttable != (FRemapTable *)0x0) && (gameinfo.gametype == GAME_Hexen)) {
    if (((char)local_90 == -0x47 && bVar10 == 0xa4) && colorset != (FPlayerColorSet *)0x0) {
      FRemapTable::operator=(alttable,table);
    }
    else {
      lVar5 = 0xa4;
      do {
        RGBtoHSV((float)GPalette.BaseColors[lVar5].field_0.field_0.r * 0.003921569,
                 (float)GPalette.BaseColors[lVar5].field_0.field_0.g * 0.003921569,
                 (float)GPalette.BaseColors[lVar5].field_0.field_0.b * 0.003921569,
                 (float *)&local_48,&local_a8,&local_ac);
        HSVtoRGB(&local_9c,&local_a0,&local_a4,local_98,local_a8 * local_84,local_ac * local_94);
        SetRemap(alttable,(int)lVar5,local_9c,local_a0,local_a4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xba);
    }
    if (alttable->Native != (FNativePalette *)0x0) {
      (*alttable->Native->_vptr_FNativePalette[2])();
    }
  }
LAB_00331a97:
  if (table->Native != (FNativePalette *)0x0) {
    (*table->Native->_vptr_FNativePalette[2])();
  }
  return;
}

Assistant:

static void R_CreatePlayerTranslation (float h, float s, float v, const FPlayerColorSet *colorset,
	FPlayerSkin *skin, FRemapTable *table, FRemapTable *alttable, FRemapTable *pillartable)
{
	int i;
	BYTE start = skin->range0start;
	BYTE end = skin->range0end;
	float r, g, b;
	float bases, basev;
	float sdelta, vdelta;
	float range;

	// Set up the base translation for this skin. If the skin was created
	// for the current game, then this is just an identity translation.
	// Otherwise, it remaps the colors from the skin's original palette to
	// the current one.
	if (skin->othergame)
	{
		memcpy (table->Remap, OtherGameSkinRemap, table->NumEntries);
		memcpy (table->Palette, OtherGameSkinPalette, sizeof(*table->Palette) * table->NumEntries);
	}
	else
	{
		for (i = 0; i < table->NumEntries; ++i)
		{
			table->Remap[i] = i;
		}
		memcpy(table->Palette, GPalette.BaseColors, sizeof(*table->Palette) * table->NumEntries);
	}
	for (i = 1; i < table->NumEntries; ++i)
	{
		table->Palette[i].a = 255;
	}

	// [GRB] Don't translate skins with color range 0-0 (APlayerPawn default)
	if (start == 0 && end == 0)
	{
		table->Inactive = true;
		table->UpdateNative();
		return;
	}

	table->Inactive = false;
	range = (float)(end-start+1);

	bases = s;
	basev = v;

	if (colorset != NULL && colorset->Lump >= 0 && Wads.LumpLength(colorset->Lump) < 256)
	{ // Bad table length. Ignore it.
		colorset = NULL;
	}

	if (colorset != NULL)
	{
		bool identity = true;
		// Use the pre-defined range instead of a custom one.
		if (colorset->Lump < 0)
		{
			identity &= SetRange(table, start, end, colorset->FirstColor, colorset->LastColor);
			for (i = 0; i < colorset->NumExtraRanges; ++i)
			{
				identity &= SetRange(table,
					colorset->Extra[i].RangeStart, colorset->Extra[i].RangeEnd,
					colorset->Extra[i].FirstColor, colorset->Extra[i].LastColor);
			}
		}
		else
		{
			FMemLump translump = Wads.ReadLump(colorset->Lump);
			const BYTE *trans = (const BYTE *)translump.GetMem();
			for (i = start; i <= end; ++i)
			{
				table->Remap[i] = GPalette.Remap[trans[i]];
				identity &= (trans[i] == i);
				table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
				table->Palette[i].a = 255;
			}
		}
		// If the colorset created an identity translation mark it as inactive
		table->Inactive = identity;
	}
	else if (gameinfo.gametype & GAME_DoomStrifeChex)
	{
		// Build player sprite translation
		s -= 0.23f;
		v += 0.1f;
		sdelta = 0.23f / range;
		vdelta = -0.94112f / range;

		for (i = start; i <= end; i++)
		{
			float uses, usev;
			uses = clamp (s, 0.f, 1.f);
			usev = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, uses, usev);
			SetRemap(table, i, r, g, b);
			s += sdelta;
			v += vdelta;
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		float vdelta = 0.418916f / range;

		// Build player sprite translation
		for (i = start; i <= end; i++)
		{
			v = vdelta * (float)(i - start) + basev - 0.2352937f;
			v = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, s, v);
			SetRemap(table, i, r, g, b);
		}

		// Build rain/lifegem translation
		if (alttable)
		{
			bases = MIN (bases*1.3f, 1.f);
			basev = MIN (basev*1.3f, 1.f);
			for (i = 145; i <= 168; i++)
			{
				s = MIN (bases, 0.8965f - 0.0962f*(float)(i - 161));
				v = MIN (1.f, (0.2102f + 0.0489f*(float)(i - 144)) * basev);
				HSVtoRGB (&r, &g, &b, h, s, v);
				SetRemap(alttable, i, r, g, b);
				SetPillarRemap(pillartable, i, h, s, v);
			}
			alttable->UpdateNative();
		}
	}
	else if (gameinfo.gametype == GAME_Hexen)
	{
		if (memcmp (sprites[skin->sprite].name, "PLAY", 4) == 0)
		{ // The fighter is different! He gets a brown hairy loincloth, but the other
		  // two have blue capes.
			float vs[9] = { .28f, .32f, .38f, .42f, .47f, .5f, .58f, .71f, .83f };

			// Build player sprite translation
			//h = 45.f;
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, s, vs[(i-start)*9/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
		else
		{
			float ms[18] = { .95f, .96f, .89f, .97f, .97f, 1.f, 1.f, 1.f, .97f, .99f, .87f, .77f, .69f, .62f, .57f, .47f, .43f };
			float mv[18] = { .16f, .19f, .22f, .25f, .31f, .35f, .38f, .41f, .47f, .54f, .60f, .65f, .71f, .77f, .83f, .89f, .94f, 1.f };

			// Build player sprite translation
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, ms[(i-start)*18/(int)range]*bases, mv[(i-start)*18/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
	}
	if (gameinfo.gametype == GAME_Hexen && alttable != NULL)
	{
		// Build Hexen's lifegem translation.
		
		// Is the player's translation range the same as the gem's and we are using a
		// predefined translation? If so, then use the same one for the gem. Otherwise,
		// build one as per usual.
		if (colorset != NULL && start == 164 && end == 185)
		{
			*alttable = *table;
		}
		else
		{
			for (i = 164; i <= 185; ++i)
			{
				const PalEntry *base = &GPalette.BaseColors[i];
				float dummy;

				RGBtoHSV (base->r/255.f, base->g/255.f, base->b/255.f, &dummy, &s, &v);
				HSVtoRGB (&r, &g, &b, h, s*bases, v*basev);
				SetRemap(alttable, i, r, g, b);
			}
		}
		alttable->UpdateNative();
	}
	table->UpdateNative();
}